

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fits_hcompress.c
# Opt level: O2

void write_bdirect64(char *outfile,LONGLONG *a,int n,int nqx,int nqy,uchar *scratch,int bit)

{
  output_nybble(outfile,0);
  qtree_onebit64(a,n,nqx,nqy,scratch,bit);
  output_nnybble(outfile,((nqx + 1) / 2) * ((nqy + 1) / 2),scratch);
  return;
}

Assistant:

static void
write_bdirect64(char *outfile, LONGLONG a[], int n,int nqx, int nqy, unsigned char scratch[], int bit)
{

	/*
	 * Write the direct bitmap warning code
	 */
	output_nybble(outfile,0x0);
	/*
	 * Copy A to scratch array (again!), packing 4 bits/nybble
	 */
	qtree_onebit64(a,n,nqx,nqy,scratch,bit);
	/*
	 * write to outfile
	 */
/*
int i;
	for (i = 0; i < ((nqx+1)/2) * ((nqy+1)/2); i++) {
		output_nybble(outfile,scratch[i]);
	}
*/
	output_nnybble(outfile, ((nqx+1)/2) * ((nqy+1)/2), scratch);
}